

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O1

void ktxFileStream_destruct(ktxStream *str)

{
  if ((str != (ktxStream *)0x0) && (str->type == eStreamTypeFile)) {
    if (str->closeOnDestruct == true) {
      fclose((FILE *)(str->data).file);
    }
    (str->data).file = (FILE *)0x0;
    return;
  }
  __assert_fail("str && str->type == eStreamTypeFile",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                ,0x186,"void ktxFileStream_destruct(ktxStream *)");
}

Assistant:

void
ktxFileStream_destruct(ktxStream* str)
{
    assert(str && str->type == eStreamTypeFile);

    if (str->closeOnDestruct)
        fclose(str->data.file);
    str->data.file = 0;
}